

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# term.c
# Opt level: O2

int main(void)

{
  FILE *__stream;
  int iVar1;
  uint *puVar2;
  char *pcVar3;
  int in_ECX;
  int in_EDX;
  int sock;
  int in_ESI;
  nn_thread thread;
  
  iVar1 = test_socket_impl((char *)0x38,in_ESI,in_EDX,in_ECX);
  test_close_impl((char *)0x39,iVar1,sock);
  nn_thread_init(&thread,worker,(void *)0x0);
  nn_sleep(100);
  nn_term();
  iVar1 = nn_socket(1,0x10);
  if (iVar1 == -1) {
    iVar1 = nn_errno();
    __stream = _stderr;
    if (iVar1 == 0x9523dfd) {
      nn_thread_term(&thread);
      return 0;
    }
    puVar2 = (uint *)__errno_location();
    pcVar3 = nn_err_strerror(*puVar2);
    fprintf(__stream,"%s [%d] (%s:%d)\n",pcVar3,(ulong)*puVar2,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/term.c",
            0x43);
  }
  else {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc == -1",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/term.c",
            0x42);
  }
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

int main ()
{
    int rc;
    int s;
    struct nn_thread thread;

    /*  Close the socket with no associated endpoints. */
    s = test_socket (AF_SP, NN_PAIR);
    test_close (s);

    /*  Test nn_term() before nn_close(). */
    nn_thread_init (&thread, worker, NULL);
    nn_sleep (100);
    nn_term ();

    /*  Check that it's not possible to create new sockets after nn_term(). */
    rc = nn_socket (AF_SP, NN_PAIR);
    nn_assert (rc == -1);
    errno_assert (nn_errno () == ETERM);

    /*  Wait till worker thread terminates. */
    nn_thread_term (&thread);

    return 0;
}